

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APInt::srem(APInt *this,APInt *RHS)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  anon_union_8_2_1313ab2f_for_U aVar4;
  APInt *in_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  ulong uVar6;
  APInt AVar7;
  anon_union_8_2_1313ab2f_for_U local_b0;
  uint local_a8;
  anon_union_8_2_1313ab2f_for_U local_a0;
  uint local_98;
  anon_union_8_2_1313ab2f_for_U local_90;
  uint local_88;
  anon_union_8_2_1313ab2f_for_U local_80;
  uint local_78;
  anon_union_8_2_1313ab2f_for_U local_70;
  uint local_68;
  anon_union_8_2_1313ab2f_for_U local_60;
  uint local_58;
  anon_union_8_2_1313ab2f_for_U local_50;
  uint local_48;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  bVar2 = operator[](RHS,RHS->BitWidth - 1);
  bVar3 = operator[](in_RDX,in_RDX->BitWidth - 1);
  if (bVar2) {
    if (bVar3) {
      local_68 = RHS->BitWidth;
      if ((ulong)local_68 < 0x41) {
        aVar4 = RHS->U;
      }
      else {
        uVar6 = (ulong)((uint)((ulong)local_68 + 0x3f >> 3) & 0xfffffff8);
        aVar4.pVal = (uint64_t *)operator_new__(uVar6);
        memcpy(aVar4.pVal,(RHS->U).pVal,uVar6);
      }
      local_70 = aVar4;
      flipAllBits((APInt *)&local_70);
      operator++((APInt *)&local_70);
      local_a8 = local_68;
      local_b0 = local_70;
      local_68 = 0;
      local_98 = in_RDX->BitWidth;
      if ((ulong)local_98 < 0x41) {
        local_a0.pVal = *(uint64_t **)&in_RDX->U;
      }
      else {
        uVar6 = (ulong)((uint)((ulong)local_98 + 0x3f >> 3) & 0xfffffff8);
        local_a0.pVal = (uint64_t *)operator_new__(uVar6);
        memcpy(local_a0.pVal,(in_RDX->U).pVal,uVar6);
      }
      flipAllBits((APInt *)&local_a0);
      operator++((APInt *)&local_a0);
      local_58 = local_98;
      local_60.VAL = local_a0.VAL;
      local_98 = 0;
      urem((APInt *)&local_40,(APInt *)&local_b0);
      flipAllBits((APInt *)&local_40);
      operator++((APInt *)&local_40);
      this->BitWidth = local_38;
      this->U = local_40;
      local_38 = 0;
      uVar5 = extraout_RDX_02;
      if ((0x40 < local_58) && (local_60.VAL != 0)) {
        operator_delete__(local_60.pVal);
        uVar5 = extraout_RDX_03;
      }
      if ((0x40 < local_98) && (local_a0.VAL != 0)) {
        operator_delete__(local_a0.pVal);
        uVar5 = extraout_RDX_04;
      }
      aVar4 = local_70;
      uVar1 = local_68;
      if ((0x40 < local_a8) && (local_b0.VAL != 0)) {
        operator_delete__(local_b0.pVal);
        uVar5 = extraout_RDX_05;
        aVar4 = local_70;
        uVar1 = local_68;
      }
    }
    else {
      local_78 = RHS->BitWidth;
      if ((ulong)local_78 < 0x41) {
        aVar4 = RHS->U;
      }
      else {
        uVar6 = (ulong)((uint)((ulong)local_78 + 0x3f >> 3) & 0xfffffff8);
        aVar4.pVal = (uint64_t *)operator_new__(uVar6);
        memcpy(aVar4.pVal,(RHS->U).pVal,uVar6);
      }
      local_80 = aVar4;
      flipAllBits((APInt *)&local_80);
      operator++((APInt *)&local_80);
      local_a8 = local_78;
      local_b0 = local_80;
      local_78 = 0;
      urem((APInt *)&local_50,(APInt *)&local_b0);
      flipAllBits((APInt *)&local_50);
      operator++((APInt *)&local_50);
      this->BitWidth = local_48;
      this->U = local_50;
      local_48 = 0;
      uVar5 = extraout_RDX_00;
      aVar4 = local_80;
      uVar1 = local_78;
      if ((0x40 < local_a8) && (local_b0.VAL != 0)) {
        operator_delete__(local_b0.pVal);
        uVar5 = extraout_RDX_01;
        aVar4 = local_80;
        uVar1 = local_78;
      }
    }
  }
  else {
    if (!bVar3) {
      AVar7 = urem(this,RHS);
      uVar5 = AVar7._8_8_;
      goto LAB_0017f3d5;
    }
    local_88 = in_RDX->BitWidth;
    if ((ulong)local_88 < 0x41) {
      aVar4.pVal = *(uint64_t **)&in_RDX->U;
    }
    else {
      uVar6 = (ulong)((uint)((ulong)local_88 + 0x3f >> 3) & 0xfffffff8);
      aVar4.pVal = (uint64_t *)operator_new__(uVar6);
      memcpy(aVar4.pVal,(in_RDX->U).pVal,uVar6);
    }
    local_90 = aVar4;
    flipAllBits((APInt *)&local_90);
    operator++((APInt *)&local_90);
    local_a8 = local_88;
    local_b0.VAL = local_90.VAL;
    local_88 = 0;
    AVar7 = urem(this,RHS);
    uVar5 = AVar7._8_8_;
    aVar4 = local_90;
    uVar1 = local_88;
    if ((0x40 < local_a8) && (local_b0.VAL != 0)) {
      operator_delete__(local_b0.pVal);
      uVar5 = extraout_RDX;
      aVar4 = local_90;
      uVar1 = local_88;
    }
  }
  if ((0x40 < uVar1) && ((void *)aVar4.VAL != (void *)0x0)) {
    operator_delete__(aVar4.pVal);
    uVar5 = extraout_RDX_06;
  }
LAB_0017f3d5:
  AVar7._8_8_ = uVar5;
  AVar7.U.pVal = (uint64_t *)this;
  return AVar7;
}

Assistant:

APInt APInt::srem(const APInt &RHS) const {
  if (isNegative()) {
    if (RHS.isNegative())
      return -((-(*this)).urem(-RHS));
    return -((-(*this)).urem(RHS));
  }
  if (RHS.isNegative())
    return this->urem(-RHS);
  return this->urem(RHS);
}